

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::shift_left(char *ext,uint shift)

{
  uint dig_00;
  size_t sVar1;
  uint in_ESI;
  char *in_RDI;
  uint dig;
  size_t i;
  size_t prec;
  ulong local_20;
  
  sVar1 = get_prec((char *)0x315e87);
  if (in_ESI != 0) {
    if ((in_ESI & 1) == 0) {
      for (local_20 = 0; local_20 + (in_ESI >> 1) < sVar1 + 1 >> 1; local_20 = local_20 + 1) {
        in_RDI[local_20 + 5] = in_RDI[local_20 + 5 + (ulong)(in_ESI >> 1)];
      }
      for (; local_20 < sVar1 + 1 >> 1; local_20 = local_20 + 1) {
        in_RDI[local_20 + 5] = '\0';
      }
      set_dig(in_RDI,sVar1 - in_ESI,0);
    }
    else {
      for (local_20 = 0; local_20 + in_ESI < sVar1; local_20 = local_20 + 1) {
        dig_00 = get_dig(in_RDI,local_20 + in_ESI);
        set_dig(in_RDI,local_20,dig_00);
      }
      for (; local_20 < sVar1; local_20 = local_20 + 1) {
        set_dig(in_RDI,local_20,0);
      }
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::shift_left(char *ext, unsigned int shift)
{
    size_t prec = get_prec(ext);
    size_t i;

    /* do nothing with a zero shift */
    if (shift == 0)
        return;

    /* if it's an even shift, it's especially easy */
    if ((shift & 1) == 0)
    {
        /* simply move the bytes left by the required amount */
        for (i = 0 ; i + shift/2 < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = ext[VMBN_MANT + i + shift/2];

        /* zero the remaining digits */
        for ( ; i < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = 0;

        /* 
         *   be sure to zero the last digit - if we have an odd precision, we
         *   will have copied the garbage digit from the final half-byte 
         */
        set_dig(ext, prec - shift, 0);
    }
    else
    {
        /* apply the shift to each digit */
        for (i = 0 ; i + shift < prec  ; ++i)
        {
            unsigned int dig;

            /* get this source digit */
            dig = get_dig(ext, i + shift);

            /* set this destination digit */
            set_dig(ext, i, dig);
        }

        /* zero the remaining digits */
        for ( ; i < prec ; ++i)
            set_dig(ext, i, 0);
    }
}